

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coherent_memory_write.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  GLbitfield GVar1;
  GLint GVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  byte bVar9;
  void *pvVar10;
  void *pvVar11;
  int i_1;
  int iVar12;
  GLuint GVar13;
  GLuint GVar14;
  GLuint GVar15;
  GLenum GVar16;
  GLint GVar17;
  int iVar18;
  GLint GVar19;
  GLFWwindow *handle;
  void *pvVar20;
  long lVar21;
  GLsync p_Var22;
  void *pvVar23;
  float *pfVar24;
  long lVar25;
  bool bVar26;
  long lVar27;
  int i_4;
  int iVar28;
  float *vertices;
  float *pfVar29;
  int iVar30;
  char *__s;
  int iVar31;
  int iVar32;
  void **ppvVar33;
  long lVar34;
  int i;
  uint uVar35;
  long lVar36;
  long lVar37;
  GLuint *pGVar38;
  GLint alignment;
  int success;
  int aiStack_2a4 [3];
  undefined1 local_298 [16];
  size_t mapping_offsets [9];
  int local_238 [4];
  undefined1 local_228 [16];
  
  glfwInit();
  uVar35 = 1;
  glfwWindowHint(0x20004,1);
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,3);
  glfwWindowHint(0x22006,1);
  glfwWindowHint(0x22008,0x32001);
  handle = glfwCreateWindow(0x400,0x400,"Coherent memory write",(GLFWmonitor *)0x0,(GLFWwindow *)0x0
                           );
  if (handle == (GLFWwindow *)0x0) {
    uVar35 = 0x7d;
  }
  else {
    glfwMakeContextCurrent(handle);
    iVar12 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar12 != 0) {
      (*glad_glGetIntegerv)(0x90df,&alignment);
      mapping_offsets[3] = sysconf(0x1e);
      mapping_offsets[1] = (size_t)alignment;
      mapping_offsets[0] = 0;
      mapping_offsets[2] = mapping_offsets[3] >> 1;
      mapping_offsets[4] = mapping_offsets[3] + mapping_offsets[1];
      mapping_offsets[5] = mapping_offsets[3] - mapping_offsets[1];
      mapping_offsets[6] = mapping_offsets[3] * 2;
      mapping_offsets[7] = mapping_offsets[3] * 10;
      mapping_offsets[8] = mapping_offsets[3] * 4 + mapping_offsets[1] * 2;
      GVar13 = (*glad_glCreateShader)(0x8b31);
      (*glad_glShaderSource)(GVar13,1,&vert_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar13);
      (*glad_glGetShaderiv)(GVar13,0x8b81,&success);
      if (success == 0) {
        (*glad_glGetShaderInfoLog)(GVar13,0x200,(GLsizei *)0x0,(GLchar *)local_238);
        printf("Vertex shader compilation failed: %s\n",local_238);
      }
      GVar14 = (*glad_glCreateShader)(0x8b30);
      (*glad_glShaderSource)(GVar14,1,&frag_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar14);
      (*glad_glGetShaderiv)(GVar14,0x8b81,&success);
      if (success == 0) {
        (*glad_glGetShaderInfoLog)(GVar14,0x200,(GLsizei *)0x0,(GLchar *)local_238);
        printf("Fragment shader compilation failed:%s\n",local_238);
      }
      GVar15 = (*glad_glCreateProgram)();
      (*glad_glAttachShader)(GVar15,GVar13);
      (*glad_glAttachShader)(GVar15,GVar14);
      (*glad_glLinkProgram)(GVar15);
      (*glad_glGetProgramiv)(GVar15,0x8b82,&success);
      if (success == 0) {
        (*glad_glGetProgramInfoLog)(GVar15,0x200,(GLsizei *)0x0,(GLchar *)local_238);
        printf("Program linking failed: %s\n",local_238);
      }
      (*glad_glDeleteShader)(GVar13);
      (*glad_glDeleteShader)(GVar14);
      if (GVar15 == 0) {
        __assert_fail("prog",
                      "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/gl/coherent_memory_write.cpp"
                      ,0x99,"void build_programm()");
      }
      lVar25 = 0;
      bVar6 = true;
      do {
        bVar26 = bVar6;
        GVar1 = (&DAT_00131068)[lVar25];
        lVar25 = 0;
        do {
          sVar5 = mapping_offsets[lVar25];
          pGVar38 = ssbo;
          (*glad_glGenBuffers)(3,ssbo);
          ppvVar33 = coherent_colors;
          lVar36 = 0;
          do {
            (*glad_glBindBufferRange)(0x90d2,(GLuint)lVar36,*pGVar38,sVar5,0x40000);
            (*glad_glBufferStorage)(0x90d2,sVar5 + 0x40000,(void *)0x0,GVar1);
            pvVar20 = (*glad_glMapNamedBufferRange)(*pGVar38,sVar5,0x40000,GVar1);
            *ppvVar33 = pvVar20;
            (*glad_glBindBuffer)(0x90d2,0);
            check_error();
            if (*pGVar38 == 0) {
              __assert_fail("ssbo[i]",
                            "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/gl/coherent_memory_write.cpp"
                            ,0xaf,
                            "bool setup_buffers(const int, const int, const size_t, const GLenum)");
            }
            lVar36 = lVar36 + 1;
            ppvVar33 = ppvVar33 + 1;
            pGVar38 = pGVar38 + 1;
          } while (lVar36 != 3);
          (*glad_glGenFramebuffers)(1,&fbo);
          (*glad_glBindFramebuffer)(0x8d40,fbo);
          (*glad_glGenRenderbuffers)(1,&rbo);
          (*glad_glBindRenderbuffer)(0x8d41,rbo);
          (*glad_glRenderbufferStorage)(0x8d41,0x1908,0x100,0x100);
          (*glad_glFramebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,rbo);
          (*glad_glGenBuffers)(1,&vbo);
          (*glad_glBindBuffer)(0x8892,vbo);
          (*glad_glBufferStorage)(0x8892,0xc0,(void *)0x0,GVar1);
          pvVar20 = (*glad_glMapBufferRange)(0x8892,0,0xc0,GVar1);
          (*glad_glGenVertexArrays)(1,&vao);
          (*glad_glBindVertexArray)(vao);
          (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0xc,(void *)0x0);
          (*glad_glEnableVertexAttribArray)(0);
          GVar16 = (*glad_glCheckFramebufferStatus)(0x8d40);
          if (GVar16 != 0x8cd5) {
            return 1;
          }
          (*glad_glBindFramebuffer)(0x8d40,0);
          check_error();
          bVar8 = true;
          lVar36 = 0;
          do {
            GVar2 = (&DAT_00131500)[lVar36 * 2];
            iVar12 = (&DAT_00131504)[lVar36 * 2];
            (*glad_glBindVertexArray)(vao);
            (*glad_glBindBuffer)(0x8892,vbo);
            pGVar38 = ssbo;
            lVar37 = 0;
            do {
              (*glad_glBindBufferRange)(0x90d2,(GLuint)lVar37,*pGVar38,sVar5,0x40000);
              lVar37 = lVar37 + 1;
              pGVar38 = pGVar38 + 1;
            } while (lVar37 != 3);
            (*glad_glUseProgram)(GVar15);
            (*glad_glBindFramebuffer)(0x8d40,fbo);
            (*glad_glViewport)(0,0,0x100,0x100);
            (*glad_glClearColor)(1.0,0.0,0.0,1.0);
            (*glad_glClear)(0x4000);
            _success = 0xffffff80ffffff80;
            aiStack_2a4[1] = 0;
            aiStack_2a4[2] = -0x80;
            local_298._0_12_ = ZEXT812(0xffffff80);
            local_298._12_4_ = 0;
            GVar17 = (*glad_glGetUniformLocation)(GVar15,"width");
            if (GVar17 != -1) {
              (*glad_glUniform1i)(GVar17,0x100);
            }
            local_238[0] = -0x80;
            local_238[1] = -0x80;
            local_238[2] = 0;
            local_238[3] = -0x80;
            local_228._0_12_ = ZEXT812(0xffffff80);
            local_228._12_4_ = 0;
            lVar21 = 0;
            lVar37 = 0;
            do {
              iVar3 = local_238[lVar21 * 2];
              iVar4 = local_238[lVar21 * 2 + 1];
              lVar27 = (long)(int)lVar37;
              lVar37 = lVar27 + 0xc;
              auVar7._4_4_ = (float)(iVar4 + 0x80) * 0.0078125;
              auVar7._0_4_ = (float)(iVar3 + 0x80) * 0.0078125;
              auVar7._8_8_ = 0;
              *(undefined1 (*) [16])((long)pvVar20 + lVar27 * 4 + 0x20) = auVar7 << 0x20;
              pfVar24 = (float *)((long)pvVar20 + lVar27 * 4);
              *pfVar24 = (float)iVar3 * 0.0078125;
              pfVar24[1] = (float)iVar4 * 0.0078125;
              pfVar24[2] = 0.0;
              pfVar24[3] = (float)iVar3 * 0.0078125;
              pfVar24 = (float *)((long)pvVar20 + lVar27 * 4 + 0x10);
              *pfVar24 = (float)(iVar4 + 0x80) * 0.0078125;
              pfVar24[1] = 0.0;
              pfVar24[2] = (float)(iVar3 + 0x80) * 0.0078125;
              pfVar24[3] = (float)iVar4 * 0.0078125;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
            lVar37 = 0;
            do {
              iVar3 = (&success)[lVar37 * 2];
              iVar4 = aiStack_2a4[lVar37 * 2];
              lVar21 = (long)iVar4 + 0x80;
              iVar28 = iVar3 + 0x80;
              GVar17 = GVar2;
              if (iVar28 == 0) {
                GVar17 = 0;
              }
              iVar18 = iVar12;
              if ((int)lVar21 == 0) {
                iVar18 = 0;
              }
              GVar19 = (*glad_glGetUniformLocation)(GVar15,"offset_x");
              if (GVar19 != -1) {
                (*glad_glUniform1i)(GVar19,GVar17);
              }
              GVar19 = (*glad_glGetUniformLocation)(GVar15,"offset_y");
              if (GVar19 != -1) {
                (*glad_glUniform1i)(GVar19,iVar18);
              }
              pvVar11 = coherent_colors[2];
              pvVar10 = coherent_colors[1];
              pvVar23 = coherent_colors[0];
              iVar30 = iVar4 * 0x100 + iVar3 + 0x8080;
              do {
                lVar27 = (long)iVar28 + -1;
                iVar31 = iVar28;
                iVar32 = iVar30;
                do {
                  lVar34 = (long)(iVar32 - (iVar18 * 0x100 + GVar17));
                  *(float *)((long)pvVar23 + lVar34 * 4) = (float)iVar31 * 0.00390625;
                  *(float *)((long)pvVar10 + lVar34 * 4) = (float)(int)lVar21 * 0.00390625;
                  *(float *)((long)pvVar11 + lVar34 * 4) = (float)iVar32 * 1.5258789e-05;
                  lVar27 = lVar27 + 1;
                  iVar32 = iVar32 + 1;
                  iVar31 = iVar31 + 1;
                } while (lVar27 < (long)iVar3 + 0xff);
                iVar30 = iVar30 + 0x100;
                bVar6 = lVar21 < (long)iVar4 + 0xff;
                lVar21 = lVar21 + 1;
              } while (bVar6);
              (*glad_glDrawArrays)(5,(int)lVar37 * 4,4);
              if ((GVar17 == 0) || (iVar18 == 0)) {
                p_Var22 = (*glad_glFenceSync)(0x9117,0);
                (*glad_glClientWaitSync)(p_Var22,1,0xffffffffffffffff);
              }
              lVar37 = lVar37 + 1;
            } while (lVar37 != 4);
            (*glad_glBindFramebuffer)(0x8ca8,fbo);
            GVar13 = 0;
            (*glad_glBindFramebuffer)(0x8ca9,0);
            (*glad_glBlitFramebuffer)(0,0,0x100,0x100,0,0,0x400,0x400,0x4000,0x2600);
            do {
              (*glad_glBindBufferBase)(0x90d2,GVar13,0);
              GVar13 = GVar13 + 1;
            } while (GVar13 != 3);
            (*glad_glBindBuffer)(0x8892,0);
            (*glad_glBindVertexArray)(0);
            glfwSwapBuffers(handle);
            glfwPollEvents();
            pvVar23 = operator_new__(0x100000);
            (*glad_glReadBuffer)(0x8ce0);
            (*glad_glReadPixels)(0,0,0x100,0x100,0x1908,0x1406,pvVar23);
            pfVar24 = (float *)((long)pvVar23 + 0xc);
            bVar9 = 1;
            iVar12 = 0;
            lVar37 = 0;
            do {
              lVar21 = 0;
              pfVar29 = pfVar24;
              do {
                if ((((0.01 < ABS((float)(int)lVar21 * -0.00390625 + pfVar29[-3])) ||
                     (0.01 < ABS(pfVar29[-2] - (float)(int)lVar37 * 0.00390625))) ||
                    (0.01 < ABS(pfVar29[-1] - (float)(iVar12 + (int)lVar21) * 1.5258789e-05))) ||
                   (0.01 < ABS(*pfVar29 + -1.0))) {
                  bVar9 = 0;
                }
                lVar21 = lVar21 + 1;
                pfVar29 = pfVar29 + 4;
              } while (lVar21 != 0x100);
              lVar37 = lVar37 + 1;
              pfVar24 = pfVar24 + 0x400;
              iVar12 = iVar12 + 0x100;
            } while (lVar37 != 0x100);
            operator_delete__(pvVar23);
            bVar8 = (bool)(bVar8 & bVar9);
            lVar36 = lVar36 + 1;
          } while (lVar36 != 3);
          pGVar38 = ssbo;
          lVar36 = 0;
          do {
            (*glad_glBindBufferRange)(0x90d2,(GLuint)lVar36,*pGVar38,sVar5,0x40000);
            (*glad_glUnmapNamedBuffer)(*pGVar38);
            (*glad_glBindBufferBase)(0x90d2,(GLuint)lVar36,0);
            lVar36 = lVar36 + 1;
            pGVar38 = pGVar38 + 1;
          } while (lVar36 != 3);
          (*glad_glBindVertexArray)(vao);
          (*glad_glBindBuffer)(0x8892,vbo);
          (*glad_glUnmapBuffer)(0x8892);
          (*glad_glBindBuffer)(0x8892,0);
          (*glad_glBindVertexArray)(0);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 9);
        lVar25 = 1;
        bVar6 = false;
      } while (bVar26);
      glfwDestroyWindow(handle);
      glfwTerminate();
      __s = "Probe failed ";
      if (bVar8) {
        __s = "Passed successfully ";
      }
      puts(__s);
      uVar35 = (uint)(byte)~bVar8;
    }
  }
  return uVar35;
}

Assistant:

int
main(int argc, char** argv) {
    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GLFW_TRUE);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

    GLFWwindow* window = glfwCreateWindow(1024, 1024, "Coherent memory write", NULL, NULL);

    if (!window) {
        return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        return EXIT_FAILURE;
    }

    GLint alignment;
    glGetIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &alignment);
    const size_t page_size = getSystemPageSize();
    const size_t ssbo_alignment = static_cast<const size_t>(alignment);

    bool pass = true;
    const int width = 256;
    const int height = 256;

    const int mapping_offsets_count = 9;
    const size_t mapping_offsets[mapping_offsets_count] = {
        0,
        ssbo_alignment,
        page_size / 2,
        page_size,
        page_size + ssbo_alignment,
        page_size - ssbo_alignment,
        page_size * 2,
        page_size * 10,
        page_size * 4 + 2 * ssbo_alignment
    };

    const int quads_offstes_count = 3;
    const int quads_offsets[quads_offstes_count][2] = {
        { width / 4, height / 4 },
        { width / 2, height / 2 },
        { 0, 0 }
    };

    const int mapping_flags_count = 2;
    const GLenum mapping_flags[mapping_flags_count] = {
        GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT,
        GL_MAP_WRITE_BIT | GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT
    };

    build_programm();

    for (int i = 0; i < mapping_flags_count; i++) {
        for (int j = 0; j < mapping_offsets_count; j++) {
            pass = setup_buffers(width, height, mapping_offsets[j], mapping_flags[i]);

            if (!pass) {
                return EXIT_FAILURE;
            }

            for (int k = 0; k < quads_offstes_count; k++) {
                draw(window, width, height, mapping_offsets[j],
                    quads_offsets[k][0], quads_offsets[k][1],
                    mapping_flags[i]);

                pass = probe(width, height) && pass;
            }
            unmap_buffers(width, height, mapping_offsets[j]);
        }
    }

    glfwDestroyWindow(window);
    glfwTerminate();

    if (pass) {
        printf("Passed successfully \n");
    } else {
        printf("Probe failed \n");
    }

    return pass ? 0 : EXIT_FAILURE;
}